

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderOutput.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderOutputRenderingBase::iterate(GeometryShaderOutputRenderingBase *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  char *description;
  bool bVar4;
  uchar result_image [1024];
  long lVar3;
  
  initTest(this);
  iVar1 = (*((this->super_GeometryShaderOutput).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1680))(this->m_program_object_id);
  (**(code **)(lVar3 + 0x1c0))(0,0,0,0);
  (**(code **)(lVar3 + 0x188))(0x4000);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not clear the color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderOutput.cpp"
                  ,0x18c);
  (**(code **)(lVar3 + 0x538))(0,0,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Call drawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderOutput.cpp"
                  ,400);
  (**(code **)(lVar3 + 0x1220))(0,0,0x10,0x10,0x1908,0x1401,result_image);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not read back pixels from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderOutput.cpp"
                  ,0x195);
  iVar1 = (*(this->super_GeometryShaderOutput).super_TestCaseBase.super_TestCase.super_TestNode.
            _vptr_TestNode[5])(this,result_image,0x10,0x10,4);
  bVar4 = (char)iVar1 == '\0';
  if (bVar4) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_GeometryShaderOutput).super_TestCaseBase.super_TestCase.super_TestNode.
             m_testCtx,(uint)bVar4,description);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderOutputRenderingBase::iterate()
{
	initTest();

	/* Variables used for image verification purposes */
	unsigned char result_image[TEXTURE_HEIGHT * TEXTURE_WIDTH * TEXTURE_PIXEL_SIZE];

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Render */
	gl.useProgram(m_program_object_id);

	gl.clearColor(0 /* red */, 0 /* green */, 0 /* blue */, 0 /* alpha */);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not clear the color buffer");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Call drawArrays() failed");

	/* Extract image from FBO */
	gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, result_image);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read back pixels from color buffer");

	/* Run verification */
	if (true == verifyResult(result_image, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_PIXEL_SIZE))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}